

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::Reg3U
          (ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,RegSlot R2,uint index)

{
  code *pcVar1;
  RegSlot index_00;
  bool bVar2;
  RegSlot R0_00;
  RegSlot RVar3;
  RegSlot R2_00;
  undefined4 *puVar4;
  FunctionBody *pFVar5;
  RegSlot local_4c;
  RegSlot local_48;
  RegSlot local_44;
  uint local_40;
  RegSlot local_3c;
  uint local_38;
  RegSlot local_34;
  
  local_3c = R2;
  local_34 = R1;
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x8f9,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_0089433a;
    *puVar4 = 0;
  }
  CheckOp(this,op,(OpLayoutType)0x6);
  CheckOpen(this);
  if (R0 != 0xffffffff) {
    pFVar5 = this->m_functionWrite;
    local_38 = (uint)op;
    if (pFVar5 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_0089433a;
      *puVar4 = 0;
      pFVar5 = this->m_functionWrite;
    }
    R0_00 = FunctionBody::MapRegSlot(pFVar5,R0);
    if (local_34 != 0xffffffff) {
      pFVar5 = this->m_functionWrite;
      if (pFVar5 == (FunctionBody *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
        if (!bVar2) goto LAB_0089433a;
        *puVar4 = 0;
        pFVar5 = this->m_functionWrite;
      }
      RVar3 = local_34;
      local_34 = index;
      RVar3 = FunctionBody::MapRegSlot(pFVar5,RVar3);
      if (local_3c != 0xffffffff) {
        pFVar5 = this->m_functionWrite;
        if (pFVar5 != (FunctionBody *)0x0) {
LAB_0089425a:
          R2_00 = FunctionBody::MapRegSlot(pFVar5,local_3c);
          index_00 = local_34;
          bVar2 = TryWriteReg3U<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                            (this,(OpCode)local_38,R0_00,RVar3,R2_00,local_34);
          if (!bVar2) {
            bVar2 = TryWriteReg3U<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                              (this,(OpCode)local_38,R0_00,RVar3,R2_00,index_00);
            if (!bVar2) {
              local_40 = index_00;
              local_4c = R0_00;
              local_48 = RVar3;
              local_44 = R2_00;
              Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,(OpCode)local_38,this);
              Data::Write(&this->m_byteCodeData,&local_4c,0x10);
            }
          }
          return;
        }
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
        if (bVar2) {
          *puVar4 = 0;
          pFVar5 = this->m_functionWrite;
          goto LAB_0089425a;
        }
        goto LAB_0089433a;
      }
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar4 = 0;
    Throw::InternalError();
  }
LAB_0089433a:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::Reg3U(OpCode op, RegSlot R0, RegSlot R1, RegSlot R2, uint index)
    {
        Assert(OpCodeAttr::HasMultiSizeLayout(op));
        CheckOp(op, OpLayoutType::Reg3U);
        CheckOpen();

        R0 = ConsumeReg(R0);
        R1 = ConsumeReg(R1);
        R2 = ConsumeReg(R2);

        MULTISIZE_LAYOUT_WRITE(Reg3U, op, R0, R1, R2, index);
    }